

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beast_Journal.cpp
# Opt level: O0

void __thiscall beast::Journal::ScopedStream::~ScopedStream(ScopedStream *this)

{
  Severity SVar1;
  Sink *pSVar2;
  bool bVar3;
  ulong uVar4;
  allocator local_69;
  string local_68 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *s;
  ScopedStream *this_local;
  
  s = (string *)this;
  std::__cxx11::ostringstream::str();
  local_18 = local_38;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar3 = std::operator==(local_18,"\n");
    if (bVar3) {
      pSVar2 = this->m_sink;
      SVar1 = this->m_level;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"",&local_69);
      (*pSVar2->_vptr_Sink[7])(pSVar2,(ulong)SVar1,local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      (*this->m_sink->_vptr_Sink[7])(this->m_sink,(ulong)this->m_level,local_18);
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_ostream);
  return;
}

Assistant:

Journal::ScopedStream::~ScopedStream ()
{
    std::string const& s (m_ostream.str());
    if (! s.empty ())
    {
        if (s == "\n")
            m_sink.write (m_level, "");
        else
            m_sink.write (m_level, s);
    }
}